

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::Seal
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar2;
  undefined8 extraout_RDX;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37];
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pDVar2,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Seal(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if (this->GetFlags() & IsSealedOnceFlag)
            {
                // Already sealed => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked() && !instance->HasObjectArray())
            {
                // If there is object array, we need to convert both type handler and array to ES5.
                // Otherwise, if the type is not shared with others, we can just change it by itself.
                return this->SealInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->Seal(instance);
    }